

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secondaryinstancewidget.cpp
# Opt level: O1

void __thiscall
SecondaryInstanceWidget::SecondaryInstanceWidget
          (SecondaryInstanceWidget *this,KDSingleApplication *kdsa,QWidget *parent)

{
  QLabel *pQVar1;
  QLineEdit *pQVar2;
  QPushButton *this_00;
  QGridLayout *this_01;
  undefined4 *puVar3;
  QArrayDataPointer<char16_t> local_70;
  code *local_58;
  ImplFn local_50;
  QObject local_48 [8];
  QObject local_40 [8];
  QObject local_38 [8];
  
  QWidget::QWidget(&this->super_QWidget,parent,0);
  *(undefined ***)this = &PTR_metaObject_00108b00;
  *(undefined ***)&this->field_0x10 = &PTR__SecondaryInstanceWidget_00108cb0;
  this->m_kdsa = kdsa;
  this->m_messageEdit = (QLineEdit *)0x0;
  QMetaObject::tr((char *)&local_70,(char *)&staticMetaObject,0x106295);
  QWidget::setWindowTitle((QString *)this);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
  pQVar1 = (QLabel *)operator_new(0x28);
  QMetaObject::tr((char *)&local_70,(char *)&staticMetaObject,0x1062a8);
  QLabel::QLabel(pQVar1,&local_70,0,0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
  pQVar2 = (QLineEdit *)operator_new(0x28);
  QLineEdit::QLineEdit(pQVar2,(QWidget *)0x0);
  this->m_messageEdit = pQVar2;
  QMetaObject::tr((char *)&local_70,(char *)&staticMetaObject,0x1062dc);
  QLineEdit::setPlaceholderText((QString *)pQVar2);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
  this_00 = (QPushButton *)operator_new(0x28);
  QMetaObject::tr((char *)&local_70,(char *)&staticMetaObject,0x1062f3);
  QPushButton::QPushButton(this_00,(QString *)&local_70,(QWidget *)0x0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
  this_01 = (QGridLayout *)operator_new(0x20);
  QGridLayout::QGridLayout(this_01,(QWidget *)0x0);
  QGridLayout::addWidget(this_01,pQVar1,0,0,1,2,0);
  QGridLayout::addWidget(this_01,this->m_messageEdit,1,0,0);
  QGridLayout::addWidget(this_01,this_00,1,1,0);
  QWidget::setLayout((QLayout *)this);
  pQVar2 = this->m_messageEdit;
  local_70.d = (Data *)QLineEdit::returnPressed;
  local_70.ptr = (char16_t *)0x0;
  local_58 = sendMessage;
  local_50 = (ImplFn)0x0;
  puVar3 = (undefined4 *)operator_new(0x20);
  *puVar3 = 1;
  *(code **)(puVar3 + 2) =
       QtPrivate::QSlotObject<void_(SecondaryInstanceWidget::*)(),_QtPrivate::List<>,_void>::impl;
  *(code **)(puVar3 + 4) = sendMessage;
  *(undefined8 *)(puVar3 + 6) = 0;
  QObject::connectImpl
            (local_38,(void **)pQVar2,(QObject *)&local_70,(void **)this,
             (QSlotObjectBase *)&local_58,(ConnectionType)puVar3,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_38);
  pQVar2 = this->m_messageEdit;
  local_70.d = (Data *)QLineEdit::textChanged;
  local_70.ptr = (char16_t *)0x0;
  puVar3 = (undefined4 *)operator_new(0x18);
  *puVar3 = 1;
  *(code **)(puVar3 + 2) =
       QtPrivate::
       QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDSingleApplication/examples/widgetsingleapplication/secondaryinstancewidget.cpp:42:19),_1,_QtPrivate::List<const_QString_&>,_void>
       ::impl;
  *(QPushButton **)(puVar3 + 4) = this_00;
  QObject::connectImpl
            (local_40,(void **)pQVar2,(QObject *)&local_70,(void **)this,(QSlotObjectBase *)0x0,
             (ConnectionType)puVar3,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_40);
  local_70.d = (Data *)QAbstractButton::clicked;
  local_70.ptr = (char16_t *)0x0;
  local_58 = sendMessage;
  local_50 = (ImplFn)0x0;
  puVar3 = (undefined4 *)operator_new(0x20);
  *puVar3 = 1;
  *(code **)(puVar3 + 2) =
       QtPrivate::QSlotObject<void_(SecondaryInstanceWidget::*)(),_QtPrivate::List<>,_void>::impl;
  *(code **)(puVar3 + 4) = sendMessage;
  *(undefined8 *)(puVar3 + 6) = 0;
  QObject::connectImpl
            (local_48,(void **)this_00,(QObject *)&local_70,(void **)this,
             (QSlotObjectBase *)&local_58,(ConnectionType)puVar3,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_48);
  return;
}

Assistant:

SecondaryInstanceWidget::SecondaryInstanceWidget(KDSingleApplication *kdsa, QWidget *parent)
    : QWidget(parent)
    , m_kdsa(kdsa)
{
    setWindowTitle(tr("Secondary instance"));
    QLabel *label = new QLabel(tr("<b>Secondary instance.</b> Send message to primary:"));
    m_messageEdit = new QLineEdit;
    m_messageEdit->setPlaceholderText(tr("Type something here..."));

    QPushButton *sendButton = new QPushButton(tr("&Send"));

    QGridLayout *layout = new QGridLayout;
    layout->addWidget(label, 0, 0, 1, 2);
    layout->addWidget(m_messageEdit, 1, 0);
    layout->addWidget(sendButton, 1, 1);

    setLayout(layout);

    connect(m_messageEdit, &QLineEdit::returnPressed, this, &SecondaryInstanceWidget::sendMessage);
    connect(m_messageEdit, &QLineEdit::textChanged,
            this, [sendButton](const QString &text) { sendButton->setEnabled(!text.isEmpty()); });
    connect(sendButton, &QPushButton::clicked, this, &SecondaryInstanceWidget::sendMessage);
}